

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O1

bool __thiscall
msgpack11::NumberValue<(msgpack11::MsgPack::Type)1,_float>::less
          (NumberValue<(msgpack11::MsgPack::Type)1,_float> *this,MsgPackValue *other)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  
  iVar2 = (*other->_vptr_MsgPackValue[3])(other);
  if (iVar2 - 1U < 10) {
    (*(this->super_Value<(msgpack11::MsgPack::Type)1,_float>).super_MsgPackValue._vptr_MsgPackValue
      [6])(this);
    (*other->_vptr_MsgPackValue[6])(other);
    bVar5 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) ==
            (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    bVar4 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) <
            (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  else {
    iVar2 = (*other->_vptr_MsgPackValue[3])(other);
    iVar3 = (*other->_vptr_MsgPackValue[3])(other);
    if (1 < iVar3) {
      return true;
    }
    if (iVar2 != 1) {
      return false;
    }
    pfVar1 = &(this->super_Value<(msgpack11::MsgPack::Type)1,_float>).m_value;
    bVar5 = *(float *)&other[1]._vptr_MsgPackValue == *pfVar1;
    bVar4 = *(float *)&other[1]._vptr_MsgPackValue < *pfVar1;
  }
  return !bVar4 && !bVar5;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        switch( other->type() )
        {
            case MsgPack::FLOAT32 : // fall through
            case MsgPack::FLOAT64 : // fall through
            case MsgPack::UINT8   : // fall through
            case MsgPack::UINT16  : // fall through
            case MsgPack::UINT32  : // fall through
            case MsgPack::UINT64  : // fall through
            case MsgPack::INT8    : // fall through
            case MsgPack::INT16   : // fall through
            case MsgPack::INT32   : // fall through
            case MsgPack::INT64   : // fall through
            {
                return float64_value() < other->float64_value();
            } break;
            default               :
            {
                return Value<tag,T>::less( other );
            } break;
        }
    }